

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O3

PIPELINE_RESOURCE_FLAGS __thiscall
Diligent::PipelineStateGLImpl::GetSamplerResourceFlag
          (PipelineStateGLImpl *this,TShaderStages *Stages,bool SilenceWarning)

{
  PIPELINE_RESOURCE_FLAGS PVar1;
  ShaderGLImpl **Stage;
  char *pcVar2;
  char *Args_1;
  byte bVar3;
  char (*in_R8) [205];
  PIPELINE_RESOURCE_FLAGS PVar4;
  bool bVar5;
  bool bVar6;
  string msg;
  string local_40;
  
  pcVar2 = (char *)(Stages->
                   super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
  Args_1 = (char *)(Stages->
                   super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar2 == Args_1) {
    FormatString<char[26],char[16]>
              (&local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!Stages.empty()",
               (char (*) [16])Args_1);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetSamplerResourceFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x45);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (char *)(Stages->
                     super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
    Args_1 = (char *)(Stages->
                     super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
  }
  PVar4 = ~PIPELINE_RESOURCE_FLAG_NONE;
  if (pcVar2 != Args_1) {
    bVar3 = 0;
    do {
      PVar1 = (*(int *)(*(long *)pcVar2 + 0x6c) != 1) * '\x02';
      bVar5 = PVar4 != PVar1;
      bVar6 = PVar4 != ~PIPELINE_RESOURCE_FLAG_NONE;
      if (bVar6) {
        PVar1 = PVar4;
      }
      PVar4 = PVar1;
      bVar6 = bVar6 && bVar5;
      in_R8 = (char (*) [205])CONCAT71((int7)((ulong)in_R8 >> 8),bVar6);
      bVar3 = bVar3 | bVar6;
      pcVar2 = pcVar2 + 8;
    } while (pcVar2 != Args_1);
    if (((~bVar3 | SilenceWarning) & 1) == 0) {
      FormatString<char[17],char_const*,char[205]>
                (&local_40,(Diligent *)"Pipeline state \'",
                 (char (*) [17])
                 &(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                  .m_Desc,(char **)
                          "\' uses shaders compiled from different source languages. When separable programs are not available, this may result in incorrect pipeline resource flags (NONE vs COMBINED_SAMPLER) determined for textures."
                 ,in_R8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,local_40._M_dataplus._M_p,0,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return PVar4;
}

Assistant:

PIPELINE_RESOURCE_FLAGS PipelineStateGLImpl::GetSamplerResourceFlag(const TShaderStages& Stages, bool SilenceWarning) const
{
    VERIFY_EXPR(!Stages.empty());

    constexpr auto UndefinedFlag = static_cast<PIPELINE_RESOURCE_FLAGS>(0xFF);

    auto SamplerResourceFlag = UndefinedFlag;
    bool ConflictsFound      = false;
    for (auto& Stage : Stages)
    {
        auto Lang = Stage->GetSourceLanguage();
        auto Flag = Lang == SHADER_SOURCE_LANGUAGE_HLSL ?
            PIPELINE_RESOURCE_FLAG_NONE :
            PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER;

        if (SamplerResourceFlag == UndefinedFlag)
            SamplerResourceFlag = Flag;
        else if (SamplerResourceFlag != Flag)
            ConflictsFound = true;
    }

    if (ConflictsFound && !SilenceWarning)
    {
        LOG_WARNING_MESSAGE("Pipeline state '", m_Desc.Name,
                            "' uses shaders compiled from different source languages. When separable programs are not available, this "
                            "may result in incorrect pipeline resource flags (NONE vs COMBINED_SAMPLER) determined for textures.");
    }

    return SamplerResourceFlag;
}